

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::from_kreach(Graph *this,string *filename)

{
  pointer pvVar1;
  uint __line;
  char cVar2;
  istream *piVar3;
  reference pvVar4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  char *__assertion;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *i;
  size_t sVar5;
  pointer pvVar6;
  vertex_t current_vertex;
  vertex_t neighbor;
  degree_t *local_578;
  size_t num_edges;
  string line;
  vertex_t num_neighbors;
  stringstream ss;
  ifstream fin;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&fin,(string *)filename,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    __assertion = "fin.is_open()";
    __line = 0x10;
  }
  else {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&fin,(string *)&line);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&num_neighbors,(string *)&line,_S_out|_S_in);
    std::__cxx11::stringstream::operator=((stringstream *)&ss,(stringstream *)&num_neighbors);
    std::__cxx11::stringstream::~stringstream((stringstream *)&num_neighbors);
    local_578 = &this->num_vertices_;
    piVar3 = std::istream::_M_extract<unsigned_int>((uint *)&ss);
    std::istream::_M_extract<unsigned_long>((ulong *)piVar3);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(&this->succ_,(ulong)this->num_vertices_);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(&this->pred_,(ulong)this->num_vertices_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->deg_,(ulong)this->num_vertices_);
    current_vertex = 0;
    sVar5 = 0;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fin,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&num_neighbors,(string *)&line,_S_out|_S_in);
      std::__cxx11::stringstream::operator=((stringstream *)&ss,(stringstream *)&num_neighbors);
      std::__cxx11::stringstream::~stringstream((stringstream *)&num_neighbors);
      std::istream::_M_extract<unsigned_int>((uint *)&ss);
      std::istream::_M_extract<unsigned_int>((uint *)&ss);
      while( true ) {
        piVar3 = std::istream::_M_extract<unsigned_int>((uint *)&ss);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        pvVar4 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::at(&this->succ_,(ulong)current_vertex);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar4,&neighbor);
        pvVar4 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::at(&this->pred_,(ulong)neighbor);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar4,&current_vertex);
        sVar5 = sVar5 + 1;
      }
    }
    if (current_vertex + 1 == *local_578) {
      if (sVar5 == num_edges) {
        pvVar1 = (this->succ_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pvVar6 = (this->succ_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pvVar6 != pvVar1;
            pvVar6 = pvVar6 + 1) {
          std::
          __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
        }
        pvVar1 = (this->pred_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pvVar6 = (this->pred_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pvVar6 != pvVar1;
            pvVar6 = pvVar6 + 1) {
          std::
          __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
        }
        std::ifstream::~ifstream(&fin);
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        return;
      }
      __assertion = "counted_edges == num_edges";
      __line = 0x2a;
    }
    else {
      __assertion = "current_vertex + 1 == num_vertices_";
      __line = 0x29;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/Graph.cpp"
                ,__line,"void Graph::from_kreach(const std::string &)");
}

Assistant:

void Graph::from_kreach(const std::string &filename) {
    stringstream ss;
    string line;

    ifstream fin(filename);
    assert(fin.is_open());

    size_t num_edges;
    getline(fin, line);
    ss = stringstream(line);
    ss >> num_vertices_ >> num_edges;

    succ_.resize(num_vertices_);
    pred_.resize(num_vertices_);
    deg_.resize(num_vertices_);

    vertex_t current_vertex = 0;
    size_t counted_edges = 0;
    for (; getline(fin, line);) {
        ss = stringstream(line);
        ss >> current_vertex;
        vertex_t num_neighbors;
        ss >> num_neighbors;
        for (vertex_t neighbor; ss >> neighbor;) {
            succ_.at(current_vertex).push_back(neighbor);
            pred_.at(neighbor).push_back(current_vertex);
            ++counted_edges;
        }
    }

    assert(current_vertex + 1 == num_vertices_);
    assert(counted_edges == num_edges);

    for (auto &i : succ_) {
        sort(i.begin(), i.end());
    }
    for (auto &i : pred_) {
        sort(i.begin(), i.end());
    }
}